

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_reporter_xml.hpp
# Opt level: O2

void __thiscall Catch::XmlReporter::sectionStarting(XmlReporter *this,SectionInfo *sectionInfo)

{
  int iVar1;
  XmlWriter *pXVar2;
  allocator local_9b;
  allocator local_9a;
  allocator local_99;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::push_back
            (&(this->super_StreamingReporterBase).m_sectionStack,sectionInfo);
  iVar1 = this->m_sectionDepth;
  this->m_sectionDepth = iVar1 + 1;
  if (0 < iVar1) {
    std::__cxx11::string::string((string *)&local_38,"Section",&local_99);
    pXVar2 = XmlWriter::startElement(&this->m_xml,&local_38);
    std::__cxx11::string::string((string *)&local_58,"name",&local_9a);
    trim(&local_78,&sectionInfo->name);
    pXVar2 = XmlWriter::writeAttribute(pXVar2,&local_58,&local_78);
    std::__cxx11::string::string((string *)&local_98,"description",&local_9b);
    XmlWriter::writeAttribute(pXVar2,&local_98,&sectionInfo->description);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

virtual void sectionStarting( SectionInfo const& sectionInfo ) {
            StreamingReporterBase::sectionStarting( sectionInfo );
            if( m_sectionDepth++ > 0 ) {
                m_xml.startElement( "Section" )
                    .writeAttribute( "name", trim( sectionInfo.name ) )
                    .writeAttribute( "description", sectionInfo.description );
            }
        }